

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O1

uint __thiscall Kernel::Clause::getNumeralWeight(Clause *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Literal **ppLVar4;
  TermList t;
  ulong uVar5;
  uint uVar6;
  TermList TVar7;
  Literal **ppLVar8;
  uint uVar9;
  uint uVar10;
  RationalConstantType ratVal;
  RealConstantType realVal;
  NonVariableIterator nvi;
  IntegerConstantType intVal;
  undefined1 auStack_e8 [16];
  __mpz_struct local_d8;
  _func_int **local_c8;
  Literal **local_c0;
  __mpz_struct local_b8;
  __mpz_struct local_a8;
  RationalConstantType local_98;
  NonVariableIterator local_78;
  __mpz_struct local_40;
  
  uVar9 = *(uint *)&this->field_0x38 & 0xfffff;
  if (uVar9 == 0) {
    uVar6 = 0;
  }
  else {
    ppLVar4 = this->_literals;
    local_c8 = (_func_int **)&PTR__NonVariableIterator_00b69ad0;
    uVar6 = 0;
    ppLVar8 = ppLVar4;
    local_c0 = ppLVar4;
    uVar10 = (uint)(uVar9 != 0);
    do {
      if ((((*ppLVar4)->super_Term).field_0xf & 0x40) != 0) {
        NonVariableIterator::NonVariableIterator(&local_78,&(*ppLVar4)->super_Term,false);
        while (local_78._stack._cursor != local_78._stack._stack) {
          t = NonVariableIterator::next(&local_78);
          if (((*(uint *)(t._content + 0xc) & 0xfffffff) == 0) &&
             ((*(byte *)(t._content + 0x28) & 0x20) == 0)) {
            mpz_init(&local_40);
            TVar7 = t;
            bVar1 = Theory::tryInterpretConstant
                              ((Theory *)theory,(Term *)t._content,(IntegerConstantType *)&local_40)
            ;
            if (bVar1) {
              iVar2 = getNumeralWeight::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)&local_40,
                                 (IntegerConstantType *)TVar7._content);
              if (iVar2 < 1) {
                iVar2 = 0;
              }
              uVar6 = uVar6 + iVar2;
            }
            else {
              RationalConstantType::RationalConstantType((RationalConstantType *)auStack_e8);
              RationalConstantType::RationalConstantType(&local_98);
              TVar7 = t;
              bVar1 = Theory::tryInterpretConstant
                                ((Theory *)theory,(Term *)t._content,
                                 (RationalConstantType *)auStack_e8);
              if (bVar1) {
LAB_0052ac65:
                iVar2 = getNumeralWeight::anon_class_1_0_00000001::operator()
                                  ((anon_class_1_0_00000001 *)auStack_e8,
                                   (IntegerConstantType *)TVar7._content);
                iVar3 = getNumeralWeight::anon_class_1_0_00000001::operator()
                                  ((anon_class_1_0_00000001 *)(auStack_e8 + 0x10),
                                   (IntegerConstantType *)TVar7._content);
                iVar3 = iVar3 + iVar2;
                if (iVar3 < 1) {
                  iVar3 = 0;
                }
                uVar6 = uVar6 + iVar3;
              }
              else {
                bVar1 = Theory::tryInterpretConstant
                                  ((Theory *)theory,(Term *)t._content,(RealConstantType *)&local_98
                                  );
                if (bVar1) {
                  IntegerConstantType::IntegerConstantType
                            ((IntegerConstantType *)&local_b8,&local_98._num);
                  IntegerConstantType::IntegerConstantType
                            ((IntegerConstantType *)&local_a8,&local_98._den);
                  mpz_swap((__mpz_struct *)auStack_e8,&local_b8);
                  TVar7._content = (uint64_t)&local_a8;
                  mpz_swap((__mpz_struct *)(auStack_e8 + 0x10),&local_a8);
                  mpz_clear(&local_a8);
                  mpz_clear(&local_b8);
                  goto LAB_0052ac65;
                }
              }
              mpz_clear(local_98._den._val);
              mpz_clear((__mpz_struct *)&local_98);
              mpz_clear((__mpz_struct *)(auStack_e8 + 0x10));
              mpz_clear((__mpz_struct *)auStack_e8);
            }
            mpz_clear(&local_40);
          }
        }
        local_78.super_IteratorCore<Kernel::TermList>._vptr_IteratorCore = local_c8;
        ppLVar8 = local_c0;
        if (local_78._stack._stack != (Term **)0x0) {
          uVar5 = local_78._stack._capacity * 8 + 0xf & 0xfffffffffffffff0;
          if (uVar5 == 0) {
            *local_78._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_78._stack._stack;
          }
          else if (uVar5 < 0x11) {
            *local_78._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_78._stack._stack;
          }
          else if (uVar5 < 0x19) {
            *local_78._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_78._stack._stack;
          }
          else if (uVar5 < 0x21) {
            *local_78._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_78._stack._stack;
          }
          else if (uVar5 < 0x31) {
            *local_78._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_78._stack._stack;
          }
          else if (uVar5 < 0x41) {
            *local_78._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_78._stack._stack;
          }
          else {
            ::operator_delete(local_78._stack._stack,0x10);
            ppLVar8 = local_c0;
          }
        }
      }
      ppLVar4 = ppLVar8 + (int)uVar10;
      bVar1 = uVar10 < uVar9;
      uVar10 = (uVar10 < uVar9) + uVar10;
    } while (bVar1);
  }
  return uVar6;
}

Assistant:

unsigned Clause::getNumeralWeight() const {
  unsigned res = 0;
  for (Literal* lit : iterLits()) {
    if (!lit->hasInterpretedConstants()) {
      continue;
    }
    NonVariableIterator nvi(lit);
    while (nvi.hasNext()) {
      const Term* t = nvi.next().term();
      if (t->arity() != 0 || t->isSort()) {
        continue;
      }
      IntegerConstantType intVal;
      auto intWeight = [](IntegerConstantType const& i) {
        return (i.abs().log2() - IntegerConstantType(1)).cvt<int>()
          .orElse([&]() { return std::numeric_limits<int>::max(); });
      };

      if (theory->tryInterpretConstant(t, intVal)) {
        int w = intWeight(intVal);
        if (w > 0) {
          res += w;
        }
        continue;
      }
      RationalConstantType ratVal;
      RealConstantType realVal;
      bool haveRat = false;

      if (theory->tryInterpretConstant(t, ratVal)) {
        haveRat = true;
      } else if (theory->tryInterpretConstant(t, realVal)) {
        ratVal = RationalConstantType(realVal);
        haveRat = true;
      }
      if (!haveRat) {
        continue;
      }
      int wN = intWeight(ratVal.numerator());
      int wD = intWeight(ratVal.denominator());
      int v = wN + wD;
      if (v > 0) {
        res += v;
      }
    }
  }
  return res;
}